

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O2

unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
* handlegraph::algorithms::dagify_from
            (unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             *__return_storage_ptr__,HandleGraph *graph,
            vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *start_handles,
            DeletableHandleGraph *into,size_t min_preserved_path_length)

{
  pointer plVar1;
  HandleGraph *pHVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  size_type sVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var_00;
  MutableHandleGraph *into_00;
  handle_t *h;
  pointer phVar7;
  pointer plVar8;
  pointer phVar9;
  __node_base *p_Var10;
  DeletableHandleGraph *into_local;
  HandleGraph *local_180;
  pointer local_178;
  pointer local_170;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> to_remove;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> into_start_handles;
  _Any_data local_130;
  code *local_120;
  code *pcStack_118;
  undefined8 local_110;
  undefined8 local_108;
  __node_base_ptr p_Stack_100;
  unordered_map<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  start_id_to_new_ids;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  visited_nodes;
  _Any_data local_88;
  _Function_base *local_78;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *local_70;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  start_nodes;
  
  if (into == (DeletableHandleGraph *)0x0) {
    into_00 = (MutableHandleGraph *)0x0;
  }
  else {
    into_00 = (MutableHandleGraph *)(&into->field_0x0 + *(long *)((long)*into + -0x110));
  }
  into_local = into;
  local_180 = graph;
  dagify(__return_storage_ptr__,graph,into_00,min_preserved_path_length);
  start_nodes._M_h._M_buckets = &start_nodes._M_h._M_single_bucket;
  start_nodes._M_h._M_bucket_count = 1;
  start_nodes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  start_nodes._M_h._M_element_count = 0;
  start_nodes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  start_nodes._M_h._M_rehash_policy._M_next_resize = 0;
  start_nodes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  phVar9 = (start_handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (phVar7 = (start_handles->
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                _M_impl.super__Vector_impl_data._M_start; phVar7 != phVar9; phVar7 = phVar7 + 1) {
    iVar3 = (*local_180->_vptr_HandleGraph[4])(local_180,phVar7);
    start_id_to_new_ids._M_h._M_buckets = (__buckets_ptr)CONCAT44(extraout_var,iVar3);
    std::__detail::
    _Insert<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&start_nodes,(value_type *)&start_id_to_new_ids);
  }
  start_id_to_new_ids._M_h._M_buckets = &start_id_to_new_ids._M_h._M_single_bucket;
  start_id_to_new_ids._M_h._M_bucket_count = 1;
  start_id_to_new_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  start_id_to_new_ids._M_h._M_element_count = 0;
  start_id_to_new_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  start_id_to_new_ids._M_h._M_rehash_policy._M_next_resize = 0;
  start_id_to_new_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var10 = &(__return_storage_ptr__->_M_h)._M_before_begin;
  while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
    sVar5 = std::
            _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&start_nodes._M_h,(key_type *)(p_Var10 + 2));
    if (sVar5 != 0) {
      pmVar6 = std::__detail::
               _Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&start_id_to_new_ids,(key_type *)(p_Var10 + 2));
      std::vector<long_long,_std::allocator<long_long>_>::push_back
                (pmVar6,(value_type_conflict2 *)(p_Var10 + 1));
    }
  }
  into_start_handles.
  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  into_start_handles.
  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  into_start_handles.
  super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phVar7 = (start_handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_178 = (start_handles->
              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    pHVar2 = local_180;
    if (phVar7 == local_178) break;
    iVar3 = (*local_180->_vptr_HandleGraph[4])(local_180,phVar7);
    visited_nodes._M_h._M_buckets = (__buckets_ptr)CONCAT44(extraout_var_00,iVar3);
    local_170 = phVar7;
    uVar4 = (*pHVar2->_vptr_HandleGraph[5])(pHVar2,phVar7);
    pmVar6 = std::__detail::
             _Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&start_id_to_new_ids,(key_type *)&visited_nodes);
    plVar1 = (pmVar6->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar8 = (pmVar6->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                  super__Vector_impl_data._M_start; plVar8 != plVar1; plVar8 = plVar8 + 1) {
      local_130._M_unused._0_8_ =
           (undefined8)
           (**(code **)(*(long *)(&into->field_0x0 + *(long *)((long)*into + -0xb0)) + 0x18))
                     (&into->field_0x0 + *(long *)((long)*into + -0xb0),plVar8,uVar4 & 0xff);
      std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      emplace_back<handlegraph::handle_t>(&into_start_handles,(handle_t *)&local_130);
    }
    phVar7 = local_170 + 1;
  }
  visited_nodes._M_h._M_buckets = &visited_nodes._M_h._M_single_bucket;
  visited_nodes._M_h._M_bucket_count = 1;
  visited_nodes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited_nodes._M_h._M_element_count = 0;
  visited_nodes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited_nodes._M_h._M_rehash_policy._M_next_resize = 0;
  visited_nodes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = (unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
              *)std::
                _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:520:9)>
                ::_M_invoke;
  local_78 = (_Function_base *)
             std::
             _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:520:9)>
             ::_M_manager;
  to_remove.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_remove.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  to_remove.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dagify.cpp:525:9)>
                ::_M_manager;
  local_130._M_unused._M_object = &p_Stack_100;
  local_130._8_8_ = 1;
  local_120 = (code *)0x0;
  pcStack_118 = (code *)0x0;
  local_110 = 0x3f800000;
  local_108 = 0;
  p_Stack_100 = (__node_base_ptr)0x0;
  local_88._M_unused._M_object = &visited_nodes;
  local_88._8_8_ = &into_local;
  internal::dfs((HandleGraph *)(&into->field_0x0 + *(long *)((long)*into + -0xb0)),
                (function<void_(const_handlegraph::handle_t_&)> *)&local_88,
                (function<void_(const_handlegraph::handle_t_&)> *)&to_remove,&into_start_handles,
                (unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                 *)&local_130);
  std::
  _Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<handlegraph::handle_t,_handlegraph::handle_t,_std::allocator<handlegraph::handle_t>,_std::__detail::_Identity,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_130);
  std::_Function_base::~_Function_base((_Function_base *)&to_remove);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  to_remove.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_remove.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  to_remove.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130._8_8_ = 0;
  pcStack_118 = std::
                _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                ::_M_invoke;
  local_120 = std::
              _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
              ::_M_manager;
  local_130._M_unused._M_object = &local_88;
  local_88._M_unused._M_object = &into_local;
  local_88._8_8_ = &visited_nodes;
  local_78 = (_Function_base *)&to_remove;
  local_70 = __return_storage_ptr__;
  (**(code **)(*(long *)(&into_local->field_0x0 + *(long *)((long)*into_local + -0xb0)) + 0x98))
            (&into_local->field_0x0 + *(long *)((long)*into_local + -0xb0),&local_130,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  phVar7 = to_remove.
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (phVar9 = to_remove.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
                _M_impl.super__Vector_impl_data._M_start; phVar9 != phVar7; phVar9 = phVar9 + 1) {
    (**(code **)((long)*into_local + 0xf8))(into_local,phVar9);
  }
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&to_remove.
              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&visited_nodes._M_h);
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&into_start_handles.
              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>);
  std::
  _Hashtable<long_long,_std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<const_long_long,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&start_id_to_new_ids._M_h);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&start_nodes._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<nid_t, nid_t> dagify_from(const HandleGraph* graph,
                                             std::vector<handle_t> start_handles,
                                             DeletableHandleGraph* into,
                                             size_t min_preserved_path_length) {
    
    // Cheating implementation
    
    // Dagify the *entire* graph, creating some nodes not reachable from the starting points.
    auto new_id_to_old_id = dagify(graph, into, min_preserved_path_length);
    
    // Find all the node IDs we have start handles on
    std::unordered_set<nid_t> start_nodes;
    for (auto& h : start_handles) {
        start_nodes.insert(graph->get_id(h));
    }
    
    // Invert enough of the ID mapping so we can translate our start handles
    std::unordered_map<nid_t, std::vector<nid_t>> start_id_to_new_ids;
    for (auto& kv : new_id_to_old_id) {
        if (start_nodes.count(kv.second)) {
            start_id_to_new_ids[kv.second].push_back(kv.first);
        }
    }
    
    // Translate all our start handles into the into graph.
    std::vector<handle_t> into_start_handles;
    for (auto& h : start_handles) {
        auto id = graph->get_id(h);
        auto is_rev = graph->get_is_reverse(h);
        for (auto& new_id : start_id_to_new_ids[id]) {
            // We know the orientations of the duplicated nodes are the same, so we just pass orientation along.
            into_start_handles.push_back(into->get_handle(new_id, is_rev));
        }
    }
    
    // Tag all the nodes we can reach on oriented walks from the starting
    // handles' copies.
    std::unordered_set<nid_t> visited_nodes;
    handlegraph::algorithms::internal::dfs(
        *into,
        [&](const handle_t& h) -> void {
            // Called when node orientation is first encountered.
            // Mark the node as reachable.
            visited_nodes.insert(into->get_id(h));
        },
        [](const handle_t& ignored) -> void {},
        into_start_handles,
        {}
    );
    
    // TODO: We're supposed to be able to destroy the current handle as we loop
    // over it, but HashGraph can't handle that.
    std::vector<handle_t> to_remove;
    into->for_each_handle([&](const handle_t& h) {
        auto node_id = into->get_id(h);
        if (!visited_nodes.count(node_id)) {
            // Destroy each handle not visited on such a walk.
            to_remove.push_back(h);
            // And the translation from it
            new_id_to_old_id.erase(node_id);
        }
    });
    for (auto& h : to_remove) {
         into->destroy_handle(h);
    }
    
    return new_id_to_old_id;
}